

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cc
# Opt level: O1

json __thiscall lrit::toJSON_abi_cxx11_(lrit *this,File *f)

{
  json_value extraout_RDX;
  json_value extraout_RDX_00;
  json_value jVar1;
  json jVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> b;
  HeaderMap m;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_40;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_58,&f->header_);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::_Rb_tree(&local_40,&(f->m_)._M_t);
  toJSON_abi_cxx11_(this,&local_58,(HeaderMap *)&local_40);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_40);
  jVar1 = extraout_RDX;
  if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    jVar1 = extraout_RDX_00;
  }
  jVar2.m_value.object = jVar1.object;
  jVar2._0_8_ = this;
  return jVar2;
}

Assistant:

json toJSON(const File& f) {
  auto b = f.getHeaderBuffer();
  auto m = f.getHeaderMap();
  return toJSON(b, m);
}